

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_output_preds(options_i *options,vw *all)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  option_group_definition *this;
  ostream *poVar4;
  allocator local_3fe;
  allocator local_3fd;
  allocator local_3fc;
  allocator local_3fb;
  allocator local_3fa;
  allocator local_3f9;
  string raw_predictions;
  string predictions;
  undefined1 local_3b8 [80];
  string local_368 [80];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8;
  string local_2b8 [32];
  string local_298 [32];
  string local_278;
  string local_258;
  option_group_definition output_options;
  undefined1 local_200 [80];
  string local_1b0 [80];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  
  predictions._M_dataplus._M_p = (pointer)&predictions.field_2;
  predictions._M_string_length = 0;
  predictions.field_2._M_local_buf[0] = '\0';
  raw_predictions._M_dataplus._M_p = (pointer)&raw_predictions.field_2;
  raw_predictions._M_string_length = 0;
  raw_predictions.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_258,"Output options",(allocator *)local_3b8);
  VW::config::option_group_definition::option_group_definition(&output_options,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&local_278,"predictions",&local_3f9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3b8,&local_278,&predictions);
  std::__cxx11::string::string(local_298,"p",&local_3fa);
  std::__cxx11::string::_M_assign(local_368);
  std::__cxx11::string::string(local_2b8,"File to output predictions to",&local_3fb);
  std::__cxx11::string::_M_assign((string *)(local_3b8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_c0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3b8);
  this = VW::config::option_group_definition::add<std::__cxx11::string>(&output_options,&local_c0);
  std::__cxx11::string::string((string *)&local_2d8,"raw_predictions",&local_3fc);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200,&local_2d8,&raw_predictions);
  std::__cxx11::string::string(local_2f8,"r",&local_3fd);
  std::__cxx11::string::_M_assign(local_1b0);
  std::__cxx11::string::string(local_318,"File to output unnormalized predictions to",&local_3fe);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_160,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200);
  VW::config::option_group_definition::add<std::__cxx11::string>(this,&local_160);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_160);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_200);
  std::__cxx11::string::~string((string *)&local_2d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_c0);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_298);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3b8);
  std::__cxx11::string::~string((string *)&local_278);
  (**options->_vptr_options_i)(options,&output_options);
  std::__cxx11::string::string((string *)local_3b8,"predictions",(allocator *)local_200);
  iVar3 = (*options->_vptr_options_i[1])(options,local_3b8);
  std::__cxx11::string::~string((string *)local_3b8);
  if ((char)iVar3 != '\0') {
    if (all->quiet == false) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"predictions = ");
      poVar4 = std::operator<<(poVar4,(string *)&predictions);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    bVar2 = std::operator==(&predictions,"stdout");
    _Var1 = predictions._M_dataplus;
    if (bVar2) {
      local_3b8._0_4_ = 1;
      v_array<int>::push_back(&all->final_prediction_sink,(int *)local_3b8);
    }
    else {
      local_3b8._0_4_ = open64(predictions._M_dataplus._M_p,0x241,0x1b6);
      if ((int)local_3b8._0_4_ < 0) {
        poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                                 "Error opening the predictions file: ");
        poVar4 = std::operator<<(poVar4,_Var1._M_p);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      v_array<int>::push_back(&all->final_prediction_sink,(int *)local_3b8);
    }
  }
  std::__cxx11::string::string((string *)local_3b8,"raw_predictions",(allocator *)local_200);
  iVar3 = (*options->_vptr_options_i[1])(options,local_3b8);
  std::__cxx11::string::~string((string *)local_3b8);
  if ((char)iVar3 != '\0') {
    if (all->quiet == false) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"raw predictions = ");
      poVar4 = std::operator<<(poVar4,(string *)&raw_predictions);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)local_3b8,"binary",(allocator *)local_200);
      iVar3 = (*options->_vptr_options_i[1])(options,local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      if ((char)iVar3 != '\0') {
        poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                                 "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    bVar2 = std::operator==(&raw_predictions,"stdout");
    if (bVar2) {
      iVar3 = 1;
    }
    else {
      iVar3 = open64(raw_predictions._M_dataplus._M_p,0x241,0x1b6);
    }
    all->raw_prediction = iVar3;
  }
  VW::config::option_group_definition::~option_group_definition(&output_options);
  std::__cxx11::string::~string((string *)&raw_predictions);
  std::__cxx11::string::~string((string *)&predictions);
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}